

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

OptionAdder * __thiscall
cxxopts::OptionAdder::operator()
          (OptionAdder *this,string *opts,string *desc,shared_ptr<const_cxxopts::Value> *value,
          string *arg_help)

{
  Options *this_00;
  bool bVar1;
  char *__s;
  const_reference this_01;
  difference_type dVar2;
  invalid_option_format_error *piVar3;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>_>_> *s;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>_>_> *l;
  string local_108;
  shared_ptr<const_cxxopts::Value> local_e8;
  string local_d8;
  anon_class_1_0_00000001 local_b1;
  undefined1 local_b0 [8];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  option_names;
  value_type *long_match;
  value_type *short_match;
  undefined1 local_50 [8];
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  string *arg_help_local;
  shared_ptr<const_cxxopts::Value> *value_local;
  string *desc_local;
  string *opts_local;
  OptionAdder *this_local;
  
  result._M_begin = (char *)arg_help;
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)local_50);
  __s = (char *)std::__cxx11::string::c_str();
  std::
  regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
            (__s,(match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  *)local_50,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             (anonymous_namespace)::option_specifier_abi_cxx11_,0);
  bVar1 = std::__cxx11::
          match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
          empty((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 *)local_50);
  if (bVar1) {
    piVar3 = (invalid_option_format_error *)__cxa_allocate_exception(0x28);
    invalid_option_format_error::invalid_option_format_error(piVar3,opts);
    __cxa_throw(piVar3,&invalid_option_format_error::typeinfo,
                invalid_option_format_error::~invalid_option_format_error);
  }
  this_01 = std::__cxx11::
            match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
            operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        *)local_50,2);
  option_names.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._8_8_ =
       std::__cxx11::
       match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
       operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)local_50,3);
  dVar2 = std::__cxx11::sub_match<const_char_*>::length(this_01);
  if (dVar2 == 0) {
    dVar2 = std::__cxx11::sub_match<const_char_*>::length
                      ((sub_match<const_char_*> *)
                       option_names.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                       ._M_head_impl.field_2._8_8_);
    if (dVar2 == 0) {
      piVar3 = (invalid_option_format_error *)__cxa_allocate_exception(0x28);
      invalid_option_format_error::invalid_option_format_error(piVar3,opts);
      __cxa_throw(piVar3,&invalid_option_format_error::typeinfo,
                  invalid_option_format_error::~invalid_option_format_error);
    }
  }
  dVar2 = std::__cxx11::sub_match<const_char_*>::length
                    ((sub_match<const_char_*> *)
                     option_names.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl.field_2._8_8_);
  if (dVar2 == 1) {
    dVar2 = std::__cxx11::sub_match<const_char_*>::length(this_01);
    if (dVar2 != 0) {
      piVar3 = (invalid_option_format_error *)__cxa_allocate_exception(0x28);
      invalid_option_format_error::invalid_option_format_error(piVar3,opts);
      __cxa_throw(piVar3,&invalid_option_format_error::typeinfo,
                  invalid_option_format_error::~invalid_option_format_error);
    }
  }
  operator()::anon_class_1_0_00000001::operator()
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_b0,&local_b1,this_01,
             (sub_match<const_char_*> *)
             option_names.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl.field_2._8_8_);
  this_00 = this->m_options;
  s = std::get<0ul,std::__cxx11::string,std::__cxx11::string>
                ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_b0);
  l = std::get<1ul,std::__cxx11::string,std::__cxx11::string>
                ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_b0);
  std::__cxx11::string::string((string *)&local_d8,(string *)desc);
  std::shared_ptr<const_cxxopts::Value>::shared_ptr(&local_e8,value);
  std::__cxx11::string::string((string *)&local_108,(string *)arg_help);
  Options::add_option(this_00,&this->m_group,s,l,&local_d8,&local_e8,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr(&local_e8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_b0);
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)local_50);
  return this;
}

Assistant:

inline OptionAdder &OptionAdder::operator()(const std::string &opts,
                                            const std::string &desc,
                                            std::shared_ptr<const Value> value,
                                            std::string arg_help) {
  std::match_results<const char *> result;
  std::regex_match(opts.c_str(), result, option_specifier);

  if (result.empty()) {
    throw invalid_option_format_error(opts);
  }

  const auto &short_match = result[2];
  const auto &long_match = result[3];

  if (!short_match.length() && !long_match.length()) {
    throw invalid_option_format_error(opts);
  } else if (long_match.length() == 1 && short_match.length()) {
    throw invalid_option_format_error(opts);
  }

  auto option_names = [](const std::sub_match<const char *> &short_,
                         const std::sub_match<const char *> &long_) {
    if (long_.length() == 1) {
      return std::make_tuple(long_.str(), short_.str());
    } else {
      return std::make_tuple(short_.str(), long_.str());
    }
  }(short_match, long_match);

  m_options.add_option(m_group, std::get<0>(option_names),
                       std::get<1>(option_names), desc, value,
                       std::move(arg_help));

  return *this;
}